

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

void output_velocities(FILE *fdf,char *s,float (*full_velocities) [512] [2],int pic_x,int pic_y,
                      int n)

{
  float fVar1;
  FILE *__s;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  void *__ptr;
  float y;
  float x;
  float local_5c;
  size_t local_58;
  int local_4c;
  FILE *local_48;
  char *local_40;
  float local_34;
  
  local_40 = s;
  if (fdf != (FILE *)0x0) {
    local_5c = (float)pic_x;
    local_34 = (float)pic_y;
    local_58 = CONCAT44(local_58._4_4_,pic_x);
    fwrite(&local_34,4,1,(FILE *)fdf);
    fwrite(&local_5c,4,1,(FILE *)fdf);
    iVar12 = (int)local_58 + n * -2;
    local_5c = (float)iVar12;
    local_4c = pic_y + n * -2;
    local_34 = (float)local_4c;
    fwrite(&local_34,4,1,(FILE *)fdf);
    fwrite(&local_5c,4,1,(FILE *)fdf);
    local_5c = (float)n;
    local_34 = local_5c;
    fwrite(&local_34,4,1,(FILE *)fdf);
    local_48 = (FILE *)fdf;
    fwrite(&local_5c,4,1,(FILE *)fdf);
    __s = local_48;
    iVar10 = (int)local_58 - n;
    uVar7 = 0;
    lVar3 = (long)n;
    uVar6 = 0;
    if (n < iVar10) {
      lVar5 = (long)full_velocities + lVar3 * 0x1008 + 4;
      uVar6 = 0;
      uVar7 = 0;
      lVar8 = lVar3;
      do {
        if (n < pic_y - n) {
          lVar9 = 0;
          do {
            fVar1 = *(float *)(lVar5 + -4 + lVar9 * 8);
            if (((fVar1 == 100.0) && (!NAN(fVar1))) ||
               ((fVar1 = *(float *)(lVar5 + lVar9 * 8), fVar1 == 100.0 && (!NAN(fVar1))))) {
              uVar7 = uVar7 + 1;
            }
            else {
              uVar6 = uVar6 + 1;
            }
            lVar9 = lVar9 + 1;
          } while ((long)pic_y + lVar3 * -2 != lVar9);
        }
        lVar8 = lVar8 + 1;
        lVar5 = lVar5 + 0x1000;
      } while (lVar8 != iVar10);
    }
    uVar11 = 0x18;
    if (n < iVar10) {
      local_58 = (size_t)(local_4c * 2);
      __ptr = (void *)((long)full_velocities + lVar3 * 0x1008);
      do {
        sVar4 = fwrite(__ptr,4,local_58,__s);
        uVar11 = uVar11 + (int)sVar4;
        __ptr = (void *)((long)__ptr + 0x1000);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    fclose(__s);
    pcVar2 = local_40;
    printf("\n%s velocities output from output_velocities: %d velocities\n",local_40,(ulong)uVar11);
    printf("Number of positions with velocity: %d\n",(ulong)uVar6);
    printf("Number of positions without velocity: %d\n",(ulong)uVar7);
    printf("Percentage of %s velocities: %f\n",
           ((double)(int)uVar6 / (double)(int)(uVar6 + uVar7)) * 100.0,pcVar2);
    fflush(_stdout);
    return;
  }
  puts("\nFatal error: full velocity file not opened");
  exit(1);
}

Assistant:

void output_velocities(FILE *fdf, char s[],
float full_velocities[PIC_X][PIC_Y][2],
int pic_x, int pic_y,
int n)
{
float x,y;
int i,j,bytes,no_novals,no_vals;

//int NORMAL = FALSE;
//if(strcmp(s,"Normal")==0) NORMAL = TRUE;
if(fdf==NULL)
	{
	printf("\nFatal error: full velocity file not opened\n");
	exit(1);
	}
/* original size */
y = (float) pic_x;
x = (float) pic_y;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* size of result data */
y = (float) (pic_x-2*n);
x = (float) (pic_y-2*n);
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* offset to start of data */
y = (float) n;
x = (float) n;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);
bytes = 24;

no_novals = no_vals = 0;
/* Prepare velocities for output, i.e. rotate by 90 degrees */
for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	if(full_velocities[i][j][0] != NO_VALUE &&
	   full_velocities[i][j][1] != NO_VALUE)
		{
		no_vals++;
		}
	else
		{
		no_novals++;
		}
	}
for(i=n;i<pic_x-n;i++)
	{
	bytes += fwrite(&full_velocities[i][n][0], 4, (pic_y-2*n)*2, fdf);
	}
fclose(fdf);
printf("\n%s velocities output from output_velocities: %d velocities\n",s,bytes);
printf("Number of positions with velocity: %d\n",no_vals);
printf("Number of positions without velocity: %d\n",no_novals);
printf("Percentage of %s velocities: %f\n",s,
	no_vals/(1.0*(no_vals+no_novals))*100.0);
fflush(stdout);
}